

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int inflatePrime(z_streamp strm,int bits,int value)

{
  uint uVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = -2;
  if ((strm != (z_streamp)0x0) &&
     (piVar2 = strm->state, bits < 0x11 && piVar2 != (internal_state *)0x0)) {
    uVar1 = *(int *)&piVar2->window + bits;
    if (uVar1 < 0x21) {
      *(long *)&piVar2->w_bits =
           *(long *)&piVar2->w_bits +
           (long)(int)((~(uint)(-1L << ((byte)bits & 0x3f)) & value) <<
                      ((byte)*(int *)&piVar2->window & 0x1f));
      *(uint *)&piVar2->window = uVar1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits > 16 || state->bits + bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += value << state->bits;
    state->bits += bits;
    return Z_OK;
}